

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TAnonMember::dump(TAnonMember *this,TInfoSink *TInfoSink,bool param_2)

{
  uint n;
  int iVar1;
  TInfoSinkBase *pTVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  char *s;
  bool param_2_local;
  TInfoSink *TInfoSink_local;
  TAnonMember *this_local;
  
  pTVar2 = TInfoSinkBase::operator<<(&TInfoSink->debug,"anonymous member ");
  n = (*(this->super_TSymbol)._vptr_TSymbol[0x17])();
  pTVar2 = TInfoSinkBase::operator<<(pTVar2,n);
  pTVar2 = TInfoSinkBase::operator<<(pTVar2," of ");
  iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[0x16])();
  this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))();
  s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      c_str(this_00);
  pTVar2 = TInfoSinkBase::operator<<(pTVar2,s);
  TInfoSinkBase::operator<<(pTVar2,"\n");
  return;
}

Assistant:

void TAnonMember::dump(TInfoSink& TInfoSink, bool) const
{
    TInfoSink.debug << "anonymous member " << getMemberNumber() << " of " << getAnonContainer().getName().c_str()
                    << "\n";
}